

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::FixHoleLinkage(Clipper *this,OutRec *outRec)

{
  reference ppOVar1;
  clipperException *this_00;
  OutRec *local_20;
  OutRec *tmp;
  OutRec *outRec_local;
  Clipper *this_local;
  
  if (outRec->bottomPt == (OutPt *)0x0) {
    local_20 = outRec->FirstLeft;
  }
  else {
    ppOVar1 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                        (&this->m_PolyOuts,(long)outRec->bottomPt->idx);
    local_20 = (*ppOVar1)->FirstLeft;
  }
  if (outRec != local_20) {
    if (local_20 != (OutRec *)0x0) {
      if (local_20->AppendLink != (OutRec *)0x0) {
        local_20 = FindAppendLinkEnd(local_20);
      }
      if (local_20 == outRec) {
        local_20 = (OutRec *)0x0;
      }
      else if ((local_20->isHole & 1U) != 0) {
        FixHoleLinkage(this,local_20);
        local_20 = local_20->FirstLeft;
      }
    }
    outRec->FirstLeft = local_20;
    if (local_20 == (OutRec *)0x0) {
      outRec->isHole = false;
    }
    outRec->AppendLink = (OutRec *)0x0;
    return;
  }
  this_00 = (clipperException *)__cxa_allocate_exception(0x28);
  clipperException::clipperException(this_00,"HoleLinkage error");
  __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
}

Assistant:

void Clipper::FixHoleLinkage(OutRec *outRec)
{
  OutRec *tmp;
  if (outRec->bottomPt)
    tmp = m_PolyOuts[outRec->bottomPt->idx]->FirstLeft;
  else
    tmp = outRec->FirstLeft;
  if (outRec == tmp) throw clipperException("HoleLinkage error");

  if (tmp)
  {
    if (tmp->AppendLink) tmp = FindAppendLinkEnd(tmp);
    if (tmp == outRec) tmp = 0;
    else if (tmp->isHole)
    {
      FixHoleLinkage(tmp);
      tmp = tmp->FirstLeft;
    }
  }
  outRec->FirstLeft = tmp;
  if (!tmp) outRec->isHole = false;
  outRec->AppendLink = 0;
}